

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-dis.c
# Opt level: O3

void atomtab_d(disctx *ctx,ull *a,ull *m,void *v)

{
  uint uVar1;
  code *pcVar2;
  long lVar3;
  
  while ((((*(ulong *)((long)v + 8) & *a) != *v ||
          (((uint)*(ulong *)((long)v + 0x310) != 0 &&
           (((uint)*(ulong *)((long)v + 0x310) & ~*ctx->varinfo->fmask) != 0)))) ||
         ((*(uint *)((long)v + 0x314) != 0 &&
          ((uVar1 = *ctx->varinfo->modes, uVar1 == 0xffffffff ||
           ((*(uint *)((long)v + 0x314) >> (uVar1 & 0x1f) & 1) == 0))))))) {
    v = (void *)((long)v + 0x318);
  }
  *m = *m | *(ulong *)((long)v + 8);
  lVar3 = 0x20;
  do {
    pcVar2 = *(code **)((long)v + lVar3 + -8);
    if (pcVar2 != (code *)0x0) {
      (*pcVar2)(ctx,a,m,*(undefined8 *)((long)v + lVar3));
    }
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 800);
  return;
}

Assistant:

void atomtab_d DPROTO {
	const struct insn *tab = v;
	int i;
	while ((a[0]&tab->mask) != tab->val || !var_ok(tab->fmask, tab->ptype, ctx->varinfo))
		tab++;
	m[0] |= tab->mask;
	for (i = 0; i < ARRAY_SIZE(tab->atoms); i++)
		if (tab->atoms[i].fun_dis)
			tab->atoms[i].fun_dis (ctx, a, m, tab->atoms[i].arg);
}